

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall
booster::log::message::message(message *this,level_type l,char *m,char *name,int line)

{
  ostringstream *this_00;
  locale lStack_28;
  
  this->level_ = l;
  this->module_ = m;
  this->file_name_ = name;
  this->file_line_ = line;
  this_00 = (ostringstream *)operator_new(0x178);
  std::__cxx11::ostringstream::ostringstream(this_00);
  (this->message_)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  (this->d).ptr_ = (data *)0x0;
  std::locale::classic();
  std::ios::imbue(&lStack_28);
  std::locale::~locale(&lStack_28);
  return;
}

Assistant:

message::message(level_type l,char const *m,char const *name,int line) :
		level_(l),
		module_(m),
		file_name_(name),
		file_line_(line),
		message_(new std::ostringstream())
	{
		message_->imbue(std::locale::classic());
	}